

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSComplexTypeDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,ComplexTypeInfo *typeInfo,XSModel *xsModel)

{
  bool bVar1;
  int iVar2;
  DefAttTypes DVar3;
  uint uVar4;
  uint uVar5;
  PSVIScope PVar6;
  SchemaAttDef *pSVar7;
  DatatypeValidator *pDVar8;
  undefined4 extraout_var;
  ComplexTypeInfo *pCVar9;
  ContentSpecNode *rootNode;
  XSAnnotation *headAnnot;
  XMLAttDefList *pXVar10;
  undefined4 extraout_var_00;
  SchemaAttDef *pSVar11;
  XSAttributeUse *toAdd;
  SchemaElementDecl *pSVar12;
  SchemaElementDecl *this_00;
  SchemaElementDecl *elemDecl;
  XMLSize_t j;
  XMLSize_t elemCount;
  XSAttributeUse *attUse;
  SchemaAttDef *attDef;
  XSAttributeDeclaration *xsAttDecl;
  uint i;
  SchemaAttDefList *attDefList_1;
  ContentSpecNode *contentSpec;
  bool isAnyType;
  SchemaAttDefList *attDefList;
  XMLSize_t attCount;
  XSParticle *xsParticle;
  XSTypeDefinition *xsBaseType;
  XSAttributeUseList *xsAttList;
  XSSimpleTypeDefinition *xsSimpleType;
  XSWildcard *xsWildcard;
  XSComplexTypeDefinition *xsObj;
  XSModel *xsModel_local;
  ComplexTypeInfo *typeInfo_local;
  XSObjectFactory *this_local;
  
  xsWildcard = (XSWildcard *)XSModel::getXSObject(xsModel,typeInfo);
  if (xsWildcard == (XSWildcard *)0x0) {
    xsSimpleType = (XSSimpleTypeDefinition *)0x0;
    xsAttList = (XSAttributeUseList *)0x0;
    xsBaseType = (XSTypeDefinition *)0x0;
    xsParticle = (XSParticle *)0x0;
    attCount = 0;
    pSVar7 = ComplexTypeInfo::getAttWildCard(typeInfo);
    if (pSVar7 != (SchemaAttDef *)0x0) {
      pSVar7 = ComplexTypeInfo::getAttWildCard(typeInfo);
      xsSimpleType = (XSSimpleTypeDefinition *)createXSWildcard(this,pSVar7,xsModel);
    }
    iVar2 = ComplexTypeInfo::getContentType(typeInfo);
    if ((iVar2 == 5) &&
       (pDVar8 = ComplexTypeInfo::getDatatypeValidator(typeInfo), pDVar8 != (DatatypeValidator *)0x0
       )) {
      pDVar8 = ComplexTypeInfo::getDatatypeValidator(typeInfo);
      xsAttList = (XSAttributeUseList *)addOrFind(this,pDVar8,xsModel,false);
    }
    attDefList = (SchemaAttDefList *)0x0;
    bVar1 = ComplexTypeInfo::hasAttDefs(typeInfo);
    if (bVar1) {
      pXVar10 = ComplexTypeInfo::getAttDefList(typeInfo);
      iVar2 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[10])();
      attDefList = (SchemaAttDefList *)CONCAT44(extraout_var,iVar2);
      xsBaseType = (XSTypeDefinition *)XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::XSAttributeUse>::RefVectorOf
                ((RefVectorOf<xercesc_4_0::XSAttributeUse> *)xsBaseType,(XMLSize_t)attDefList,false,
                 this->fMemoryManager);
    }
    bVar1 = false;
    pCVar9 = ComplexTypeInfo::getBaseComplexTypeInfo(typeInfo);
    if (pCVar9 == typeInfo) {
      bVar1 = true;
    }
    else {
      pCVar9 = ComplexTypeInfo::getBaseComplexTypeInfo(typeInfo);
      if (pCVar9 == (ComplexTypeInfo *)0x0) {
        pDVar8 = ComplexTypeInfo::getBaseDatatypeValidator(typeInfo);
        if (pDVar8 == (DatatypeValidator *)0x0) {
          xsParticle = (XSParticle *)
                       XSModel::getTypeDefinition
                                 (xsModel,(XMLCh *)SchemaSymbols::fgATTVAL_ANYTYPE,
                                  (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        }
        else {
          pDVar8 = ComplexTypeInfo::getBaseDatatypeValidator(typeInfo);
          xsParticle = (XSParticle *)addOrFind(this,pDVar8,xsModel,false);
        }
      }
      else {
        pCVar9 = ComplexTypeInfo::getBaseComplexTypeInfo(typeInfo);
        xsParticle = (XSParticle *)addOrFind(this,pCVar9,xsModel);
      }
    }
    rootNode = ComplexTypeInfo::getContentSpec(typeInfo);
    if (rootNode != (ContentSpecNode *)0x0) {
      attCount = (XMLSize_t)createModelGroupParticle(this,rootNode,xsModel);
    }
    xsWildcard = (XSWildcard *)XMemory::operator_new(0x70,this->fMemoryManager);
    headAnnot = getAnnotationFromModel(this,xsModel,typeInfo);
    XSComplexTypeDefinition::XSComplexTypeDefinition
              ((XSComplexTypeDefinition *)xsWildcard,typeInfo,(XSWildcard *)xsSimpleType,
               (XSSimpleTypeDefinition *)xsAttList,(XSAttributeUseList *)xsBaseType,
               (XSTypeDefinition *)xsParticle,(XSParticle *)attCount,headAnnot,xsModel,
               this->fMemoryManager);
    putObjectInMap(this,typeInfo,(XSObject *)xsWildcard);
    if (bVar1) {
      XSComplexTypeDefinition::setBaseType
                ((XSComplexTypeDefinition *)xsWildcard,(XSTypeDefinition *)xsWildcard);
    }
    bVar1 = ComplexTypeInfo::hasAttDefs(typeInfo);
    if (bVar1) {
      pXVar10 = ComplexTypeInfo::getAttDefList(typeInfo);
      for (xsAttDecl._4_4_ = 0; (SchemaAttDefList *)(ulong)xsAttDecl._4_4_ < attDefList;
          xsAttDecl._4_4_ = xsAttDecl._4_4_ + 1) {
        iVar2 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[0xb])
                          (pXVar10,(ulong)xsAttDecl._4_4_);
        pSVar7 = (SchemaAttDef *)CONCAT44(extraout_var_00,iVar2);
        pSVar11 = SchemaAttDef::getBaseAttDecl(pSVar7);
        if (pSVar11 == (SchemaAttDef *)0x0) {
          attDef = (SchemaAttDef *)
                   addOrFind(this,pSVar7,xsModel,(XSComplexTypeDefinition *)xsWildcard);
        }
        else {
          pSVar11 = SchemaAttDef::getBaseAttDecl(pSVar7);
          attDef = (SchemaAttDef *)addOrFind(this,pSVar11,xsModel,(XSComplexTypeDefinition *)0x0);
          RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::PtrHasher>::put
                    (this->fXercesToXSMap,pSVar7,(XSObject *)attDef);
        }
        DVar3 = XMLAttDef::getDefaultType((XMLAttDef *)pSVar7);
        if (DVar3 != DefAttTypes_Max) {
          toAdd = createXSAttributeUse(this,(XSAttributeDeclaration *)attDef,xsModel);
          BaseRefVectorOf<xercesc_4_0::XSAttributeUse>::addElement
                    ((BaseRefVectorOf<xercesc_4_0::XSAttributeUse> *)xsBaseType,toAdd);
          processAttUse(this,pSVar7,toAdd);
        }
      }
    }
    pSVar12 = (SchemaElementDecl *)ComplexTypeInfo::elementCount(typeInfo);
    for (elemDecl = (SchemaElementDecl *)0x0; elemDecl < pSVar12;
        elemDecl = (SchemaElementDecl *)
                   ((long)&(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable
                   + 1)) {
      this_00 = ComplexTypeInfo::elementAt(typeInfo,(XMLSize_t)elemDecl);
      uVar4 = SchemaElementDecl::getEnclosingScope(this_00);
      uVar5 = ComplexTypeInfo::getScopeDefined(typeInfo);
      if ((uVar4 == uVar5) && (PVar6 = SchemaElementDecl::getPSVIScope(this_00), PVar6 == SCP_LOCAL)
         ) {
        addOrFind(this,this_00,xsModel,(XSComplexTypeDefinition *)xsWildcard);
      }
    }
  }
  return (XSComplexTypeDefinition *)xsWildcard;
}

Assistant:

XSComplexTypeDefinition*
XSObjectFactory::addOrFind(ComplexTypeInfo* const typeInfo,
                           XSModel* const xsModel)
{
    XSComplexTypeDefinition* xsObj = (XSComplexTypeDefinition*) xsModel->getXSObject(typeInfo);
    if (!xsObj)
    {
        XSWildcard*             xsWildcard = 0;
        XSSimpleTypeDefinition* xsSimpleType = 0;
        XSAttributeUseList*     xsAttList = 0;
        XSTypeDefinition*       xsBaseType = 0;
        XSParticle*             xsParticle = 0;

        if (typeInfo->getAttWildCard())
            xsWildcard = createXSWildcard(typeInfo->getAttWildCard(), xsModel);

        if ((typeInfo->getContentType() == SchemaElementDecl::Simple) &&
            (typeInfo->getDatatypeValidator()))
            xsSimpleType = addOrFind(typeInfo->getDatatypeValidator(), xsModel);

        XMLSize_t attCount=0;
        if (typeInfo->hasAttDefs())
        {
            SchemaAttDefList& attDefList = (SchemaAttDefList&) typeInfo->getAttDefList();
            attCount = attDefList.getAttDefCount();
            xsAttList = new (fMemoryManager) RefVectorOf<XSAttributeUse>(attCount, false, fMemoryManager);
            // create list now put fill it in after we put complextype into map
            // otherwise we may encounter an infinite loop: complextype needs to
            // addorfind attdef, which does an addorfind on the enclosingCTdefintion.
        }

        // compute fBase
        bool isAnyType = false;
        if (typeInfo->getBaseComplexTypeInfo() == typeInfo) // case of anyType
            isAnyType = true;
        else if (typeInfo->getBaseComplexTypeInfo())
            xsBaseType = addOrFind(typeInfo->getBaseComplexTypeInfo(), xsModel);
        else if (typeInfo->getBaseDatatypeValidator())
            xsBaseType = addOrFind(typeInfo->getBaseDatatypeValidator(), xsModel);
        else // base is anyType
            xsBaseType = xsModel->getTypeDefinition(SchemaSymbols::fgATTVAL_ANYTYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);

        // compute particle
        ContentSpecNode* contentSpec = typeInfo->getContentSpec();
        if (contentSpec)
            xsParticle = createModelGroupParticle(contentSpec, xsModel);

        xsObj = new (fMemoryManager) XSComplexTypeDefinition
        (
            typeInfo
            , xsWildcard
            , xsSimpleType
            , xsAttList
            , xsBaseType
            , xsParticle
            , getAnnotationFromModel(xsModel, typeInfo)
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(typeInfo, xsObj);

        if (isAnyType)
            xsObj->setBaseType(xsObj);

        if (typeInfo->hasAttDefs())
        {
            // now create the xsattributedeclarations...
            SchemaAttDefList& attDefList = (SchemaAttDefList&) typeInfo->getAttDefList();
            for(unsigned int i=0; i<attCount; i++)
            {
                XSAttributeDeclaration* xsAttDecl = 0;
                SchemaAttDef& attDef = (SchemaAttDef&) attDefList.getAttDef(i);

                if (attDef.getBaseAttDecl())
                {
                    xsAttDecl = addOrFind(attDef.getBaseAttDecl(), xsModel);
                    fXercesToXSMap->put(&attDef, xsAttDecl);
                }
                else
                    xsAttDecl = addOrFind(&attDef, xsModel, xsObj);

                if (attDef.getDefaultType() != XMLAttDef::Prohibited) {

                    XSAttributeUse* attUse = createXSAttributeUse(xsAttDecl, xsModel);
                    xsAttList->addElement(attUse);
                    processAttUse(&attDef, attUse);
                }
            }
        }

        // process local elements
        XMLSize_t elemCount = typeInfo->elementCount();
        for (XMLSize_t j=0; j<elemCount; j++)
        {
            SchemaElementDecl* elemDecl = typeInfo->elementAt(j);

            if (elemDecl->getEnclosingScope() == typeInfo->getScopeDefined()
                && elemDecl->getPSVIScope() == PSVIDefs::SCP_LOCAL)
                addOrFind(elemDecl, xsModel, xsObj);
        }
    }

    return xsObj;
}